

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O2

longlong __thiscall BigInt::operator%(BigInt *this,longlong val)

{
  pair<BigInt,_long_long> pStack_38;
  
  divModValue(&pStack_38,this,val);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)&pStack_38);
  return pStack_38.second;
}

Assistant:

long long operator%(long long val) const { //! divide by val
        return divModValue(val).second;
    }